

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::compoundStmt(Parse *this)

{
  int iVar1;
  DelimiterTable *pDVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  bool bVar6;
  allocator local_71;
  key_type local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  key_type local_38;
  Parse *local_18;
  Parse *this_local;
  
  local_18 = this;
  pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                     (this->tokenVec,(long)this->curIndex);
  local_3a = 0;
  local_4d = 0;
  bVar6 = false;
  if (pvVar3->type == DELIMTER) {
    pDVar2 = this->delimiterTable;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"{",&local_39);
    local_4d = 1;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar2->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_38);
    iVar1 = *pmVar4;
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar6 = iVar1 == pvVar3->id;
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (bVar6) {
    this->curIndex = this->curIndex + 1;
    localDeclarations(this);
    statementList(this);
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar6 = false;
    if (pvVar3->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"}",&local_71);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_70);
      iVar1 = *pmVar4;
      pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar6 = iVar1 == pvVar3->id;
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    if (!bVar6) {
      poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_218e8);
      pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar3->line + -1);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curIndex = this->curIndex + 1;
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::compoundStmt() {
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["{"] == tokenVec[curIndex].id) {
        curIndex++;
        localDeclarations();
        statementList();
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["}"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            //cout << tokenVec[curIndex].name << endl;
            cout << "函数定义缺少右括号在第" << tokenVec[curIndex].line- 1  << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}